

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.hpp
# Opt level: O1

basic_ostream<char,_std::char_traits<char>_> *
toml::operator<<(basic_ostream<char,_std::char_traits<char>_> *os,value_t t)

{
  long lVar1;
  undefined7 in_register_00000031;
  char *pcVar2;
  
  switch(CONCAT71(in_register_00000031,t) & 0xffffffff) {
  case 0:
    pcVar2 = "empty";
    goto LAB_0014f276;
  case 1:
    pcVar2 = "boolean";
    goto LAB_0014f292;
  case 2:
    pcVar2 = "integer";
    goto LAB_0014f292;
  case 3:
    pcVar2 = "floating";
    lVar1 = 8;
    break;
  case 4:
    pcVar2 = "string";
    lVar1 = 6;
    break;
  case 5:
    pcVar2 = "offset_datetime";
    lVar1 = 0xf;
    break;
  case 6:
    pcVar2 = "local_datetime";
    lVar1 = 0xe;
    break;
  case 7:
    pcVar2 = "the next token is not a local_date";
    goto LAB_0014f284;
  case 8:
    pcVar2 = "the next token is not a local_time";
LAB_0014f284:
    pcVar2 = pcVar2 + 0x18;
    lVar1 = 10;
    break;
  case 9:
    pcVar2 = "array";
    goto LAB_0014f276;
  case 10:
    pcVar2 = "table";
LAB_0014f276:
    lVar1 = 5;
    break;
  default:
    pcVar2 = "unknown";
LAB_0014f292:
    lVar1 = 7;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar2,lVar1);
  return os;
}

Assistant:

inline std::basic_ostream<charT, traits>&
operator<<(std::basic_ostream<charT, traits>& os, value_t t)
{
    switch(t)
    {
        case value_t::boolean         : os << "boolean";         return os;
        case value_t::integer         : os << "integer";         return os;
        case value_t::floating        : os << "floating";        return os;
        case value_t::string          : os << "string";          return os;
        case value_t::offset_datetime : os << "offset_datetime"; return os;
        case value_t::local_datetime  : os << "local_datetime";  return os;
        case value_t::local_date      : os << "local_date";      return os;
        case value_t::local_time      : os << "local_time";      return os;
        case value_t::array           : os << "array";           return os;
        case value_t::table           : os << "table";           return os;
        case value_t::empty           : os << "empty";           return os;
        default                       : os << "unknown";         return os;
    }
}